

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoord3D
               (vector<float,_std::allocator<float>_> *dst,Vec3 *p0,Vec3 *p1,IVec3 *dirSwz)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  float *pfVar5;
  reference pvVar6;
  Vector<float,_3> local_118;
  Vector<float,_3> local_10c;
  undefined1 local_100 [8];
  Vec3 v3;
  Vector<float,_3> local_e8;
  undefined1 local_dc [8];
  Vec3 v2;
  Vector<float,_3> local_c4;
  undefined1 local_b8 [8];
  Vec3 v1;
  Vector<float,_3> local_a0;
  undefined1 local_94 [8];
  Vec3 v0;
  undefined1 local_7c [8];
  Vec3 f3;
  undefined1 local_64 [8];
  Vec3 f2;
  undefined1 local_4c [8];
  Vec3 f1;
  undefined1 local_34 [8];
  Vec3 f0;
  IVec3 *dirSwz_local;
  Vec3 *p1_local;
  Vec3 *p0_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  f0.m_data._4_8_ = dirSwz;
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(f1.m_data + 1),0.0,0.0,0.0);
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,1);
  iVar3 = *piVar4;
  tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,2);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_34,(int)&f1 + 4,iVar2,iVar3);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(f2.m_data + 1),0.0,1.0,0.0);
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,1);
  iVar3 = *piVar4;
  tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,2);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_4c,(int)&f2 + 4,iVar2,iVar3);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(f3.m_data + 1),1.0,0.0,0.0);
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,1);
  iVar3 = *piVar4;
  tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,2);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_64,(int)&f3 + 4,iVar2,iVar3);
  tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(v0.m_data + 1),1.0,1.0,0.0);
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,0);
  iVar2 = *piVar4;
  piVar4 = tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,1);
  iVar3 = *piVar4;
  tcu::Vector<int,_3>::operator[]((Vector<int,_3> *)f0.m_data._4_8_,2);
  tcu::Vector<float,_3>::swizzle((Vector<float,_3> *)local_7c,(int)&v0 + 4,iVar2,iVar3);
  tcu::operator-((tcu *)(v1.m_data + 1),p1,p0);
  tcu::operator*((tcu *)&local_a0,(Vector<float,_3> *)(v1.m_data + 1),(Vector<float,_3> *)local_34);
  tcu::operator+((tcu *)local_94,p0,&local_a0);
  tcu::operator-((tcu *)(v2.m_data + 1),p1,p0);
  tcu::operator*((tcu *)&local_c4,(Vector<float,_3> *)(v2.m_data + 1),(Vector<float,_3> *)local_4c);
  tcu::operator+((tcu *)local_b8,p0,&local_c4);
  tcu::operator-((tcu *)(v3.m_data + 1),p1,p0);
  tcu::operator*((tcu *)&local_e8,(Vector<float,_3> *)(v3.m_data + 1),(Vector<float,_3> *)local_64);
  tcu::operator+((tcu *)local_dc,p0,&local_e8);
  tcu::operator-((tcu *)&local_118,p1,p0);
  tcu::operator*((tcu *)&local_10c,&local_118,(Vector<float,_3> *)local_7c);
  tcu::operator+((tcu *)local_100,p0,&local_10c);
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_94);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,0);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_94);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,1);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_94);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,2);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,3);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,4);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_b8);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,5);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_dc);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,6);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_dc);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,7);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_dc);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,8);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_100);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,9);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_100);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,10);
  *pvVar6 = fVar1;
  pfVar5 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_100);
  fVar1 = *pfVar5;
  pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](dst,0xb);
  *pvVar6 = fVar1;
  return;
}

Assistant:

void computeQuadTexCoord3D (std::vector<float>& dst, const tcu::Vec3& p0, const tcu::Vec3& p1, const tcu::IVec3& dirSwz)
{
	tcu::Vec3 f0 = tcu::Vec3(0.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f1 = tcu::Vec3(0.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f2 = tcu::Vec3(1.0f, 0.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);
	tcu::Vec3 f3 = tcu::Vec3(1.0f, 1.0f, 0.0f).swizzle(dirSwz[0], dirSwz[1], dirSwz[2]);

	tcu::Vec3 v0 = p0 + (p1-p0)*f0;
	tcu::Vec3 v1 = p0 + (p1-p0)*f1;
	tcu::Vec3 v2 = p0 + (p1-p0)*f2;
	tcu::Vec3 v3 = p0 + (p1-p0)*f3;

	dst.resize(4*3);

	dst[0] = v0.x(); dst[ 1] = v0.y(); dst[ 2] = v0.z();
	dst[3] = v1.x(); dst[ 4] = v1.y(); dst[ 5] = v1.z();
	dst[6] = v2.x(); dst[ 7] = v2.y(); dst[ 8] = v2.z();
	dst[9] = v3.x(); dst[10] = v3.y(); dst[11] = v3.z();
}